

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDVertex::FaceArrayIndex(ON_SubDVertex *this,ON_SubDFace *face)

{
  uint local_28;
  uint i;
  uint face_count;
  ON_SubDFace *face_local;
  ON_SubDVertex *this_local;
  
  if ((face != (ON_SubDFace *)0x0) && (this->m_face_count != 0)) {
    if (this->m_faces == (ON_SubDFace **)0x0) {
      ON_SubDIncrementErrorCount();
    }
    else {
      for (local_28 = 0; local_28 < this->m_face_count; local_28 = local_28 + 1) {
        if (face == this->m_faces[local_28]) {
          return local_28;
        }
      }
    }
  }
  return 0xffffffff;
}

Assistant:

unsigned int ON_SubDVertex::FaceArrayIndex(
  const ON_SubDFace* face
  ) const
{
  if ( nullptr == face )
    return ON_UNSET_UINT_INDEX;
  const unsigned int face_count = m_face_count;
  if ( 0 == face_count)
    return ON_UNSET_UINT_INDEX;
  if ( nullptr == m_faces)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_UINT_INDEX);

  for ( unsigned int i = 0; i < face_count; i++)
  {
    if (face == m_faces[i] )
      return i;
  }

  return ON_UNSET_UINT_INDEX;
}